

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_reservoir_sample.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalReservoirSample::GetData
          (PhysicalReservoirSample *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  DataChunk *in_RAX;
  pointer pGVar1;
  pointer pBVar2;
  type chunk_00;
  bool bVar3;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> sample_chunk;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  pGVar1 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalOperator).sink_state);
  ::std::mutex::lock((mutex *)&((pthread_mutex_t *)(pGVar1 + 1))->__data);
  if (pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.__prev
      == (__pthread_internal_list *)0x0) {
    bVar3 = true;
  }
  else {
    pBVar2 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
             operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                         *)&pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex
                            .__data.__list);
    (*pBVar2->_vptr_BlockingSample[6])(&local_28,pBVar2);
    bVar3 = local_28._M_head_impl == (DataChunk *)0x0;
    if (!bVar3) {
      chunk_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                            *)&local_28);
      DataChunk::Move(chunk,chunk_00);
    }
    ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)&local_28);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(pGVar1 + 1));
  return bVar3;
}

Assistant:

SourceResultType PhysicalReservoirSample::GetData(ExecutionContext &context, DataChunk &chunk,
                                                  OperatorSourceInput &input) const {
	auto &sink = this->sink_state->Cast<SampleGlobalSinkState>();
	lock_guard<mutex> glock(sink.lock);
	if (!sink.sample) {
		return SourceResultType::FINISHED;
	}
	auto sample_chunk = sink.sample->GetChunk();

	if (!sample_chunk) {
		return SourceResultType::FINISHED;
	}
	chunk.Move(*sample_chunk);

	return SourceResultType::HAVE_MORE_OUTPUT;
}